

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

UnqualifiedName * __thiscall soul::StructuralParser::parseUnqualifiedName(StructuralParser *this)

{
  char *__s1;
  int iVar1;
  UnqualifiedName *pUVar2;
  Identifier identifier;
  Context context;
  Identifier local_60;
  Context local_58;
  CompileMessage local_40;
  
  local_58.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_58.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_58.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_58.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_58.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_58.parentScope = this->currentScope;
  local_60 = parseIdentifierWithMaxLength(this,0x80);
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 != "::") {
    if (__s1 == (char *)0x0) goto LAB_001f9e5d;
    iVar1 = strcmp(__s1,"::");
    if (iVar1 != 0) goto LAB_001f9e5d;
  }
  CompileMessageHelpers::createMessage<>
            (&local_40,syntax,error,"This identifier cannot have a namespace qualifier");
  (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_40);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_40.location.sourceCode.object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.description._M_dataplus._M_p != &local_40.description.field_2) {
    operator_delete(local_40.description._M_dataplus._M_p,
                    local_40.description.field_2._M_allocated_capacity + 1);
  }
LAB_001f9e5d:
  pUVar2 = PoolAllocator::allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier&>
                     (&this->allocator->pool,&local_58,&local_60);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.location.sourceCode.object);
  return pUVar2;
}

Assistant:

AST::UnqualifiedName& parseUnqualifiedName()
    {
        auto context = getContext();
        auto identifier = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        if (matches (Operator::doubleColon))
            throwError (Errors::identifierMustBeUnqualified());

        return allocate<AST::UnqualifiedName> (context, identifier);
    }